

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTester_2000_2999.cpp
# Opt level: O2

void __thiscall psy::C::ParserTester::case2509(ParserTester *this)

{
  allocator<char> local_e1;
  string local_e0;
  Expectation local_c0;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,
             "\n                   while ( 1 )\n                       break ;\n                   "
             ,&local_e1);
  Expectation::Expectation(&local_c0);
  parseStatement(this,&local_e0,&local_c0);
  Expectation::~Expectation(&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  return;
}

Assistant:

void ParserTester::case2509()
{
    parseStatement(R"(
                   while ( 1 )
                       break ;
                   )");
}